

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O2

string * __thiscall
JointPolicyPureVectorForClusteredBG::SoftPrintBrief_abi_cxx11_
          (string *__return_storage_ptr__,JointPolicyPureVectorForClusteredBG *this)

{
  Interface_ProblemToPolicyDiscretePure *pIVar1;
  ostream *poVar2;
  E *this_00;
  stringstream ss;
  shared_count local_198;
  ostream local_190 [376];
  
  JointPolicyDiscretePure::GetInterfacePTPDiscretePureShared((JointPolicyDiscretePure *)&ss);
  if (_ss == 0) {
    pIVar1 = JointPolicyDiscretePure::GetInterfacePTPDiscretePure((JointPolicyDiscretePure *)this);
    boost::detail::shared_count::~shared_count(&local_198);
    if (pIVar1 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,"JointPolicyPureVectorForClusteredBG:SoftPrintBrief - Error!!! PTPDP==0");
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
  }
  else {
    boost::detail::shared_count::~shared_count(&local_198);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_190,"JPPV4CBG_d");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"_cur");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<(poVar2,"_prev");
  boost::operator<<(poVar2,&this->_m_prevJPolBG);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

string JointPolicyPureVectorForClusteredBG::SoftPrintBrief() const
{
    if(JointPolicyDiscretePure::GetInterfacePTPDiscretePureShared() == 0 &&
       JointPolicyDiscretePure::GetInterfacePTPDiscretePure() == 0)
        throw E("JointPolicyPureVectorForClusteredBG:SoftPrintBrief - Error!!! PTPDP==0");
            
    stringstream ss;
    ss << "JPPV4CBG_d"<<GetDepth() << "_cur" << this << "_prev" << _m_prevJPolBG;
    return(ss.str());
}